

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O2

void Fxch_ManUpdate(Fxch_Man_t *pFxchMan,int iDiv)

{
  byte *pbVar1;
  Hsh_VecMan_t *pHVar2;
  Vec_Wec_t *pVVar3;
  Vec_Wec_t *pVVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int *piVar14;
  Vec_Int_t *pVVar15;
  Vec_Int_t *pVVar16;
  Vec_Int_t *pVVar17;
  long lVar18;
  int *piVar19;
  int iLit;
  int iLit_00;
  int k;
  int k_00;
  int k_01;
  int *piVar20;
  int *piVar21;
  int *piVar22;
  int *piVar23;
  uint i;
  int *piVar24;
  bool bVar25;
  int *local_70;
  
  pVVar15 = pFxchMan->vDiv;
  pVVar15->nSize = 0;
  pHVar2 = pFxchMan->pDivHash;
  pVVar16 = pHVar2->vData;
  iVar5 = Vec_IntEntry(pHVar2->vMap,iDiv);
  piVar14 = Vec_IntEntryP(pVVar16,iVar5);
  iVar5 = *piVar14;
  (pHVar2->vTemp).nCap = iVar5;
  (pHVar2->vTemp).nSize = iVar5;
  (pHVar2->vTemp).pArray = piVar14 + 2;
  Vec_IntAppend(pVVar15,&pHVar2->vTemp);
  pFxchMan->vCubesS->nSize = 0;
  if (pFxchMan->vDiv->nSize == 2) {
    iVar5 = Vec_IntEntry(pFxchMan->vDiv,0);
    iVar6 = Abc_Lit2Var(iVar5);
    iVar5 = Vec_IntEntry(pFxchMan->vDiv,1);
    iVar7 = Abc_Lit2Var(iVar5);
    pVVar3 = pFxchMan->vCubes;
    pVVar4 = pFxchMan->vLits;
    iVar5 = Abc_LitNot(iVar6);
    pVVar15 = Vec_WecEntry(pVVar4,iVar5);
    Fxch_ManCompressCubes(pVVar3,pVVar15);
    pVVar3 = pFxchMan->vCubes;
    pVVar4 = pFxchMan->vLits;
    iVar5 = Abc_LitNot(iVar7);
    pVVar15 = Vec_WecEntry(pVVar4,iVar5);
    Fxch_ManCompressCubes(pVVar3,pVVar15);
    pVVar3 = pFxchMan->vLits;
    iVar5 = Abc_LitNot(iVar6);
    pVVar16 = Vec_WecEntry(pVVar3,iVar5);
    pVVar3 = pFxchMan->vLits;
    iVar5 = Abc_LitNot(iVar7);
    pVVar17 = Vec_WecEntry(pVVar3,iVar5);
    pVVar15 = pFxchMan->vCubesS;
    piVar19 = pVVar16->pArray;
    local_70 = pVVar17->pArray;
    piVar23 = piVar19 + pVVar16->nSize;
    iVar5 = pVVar17->nSize;
    pVVar15->nSize = 0;
    piVar14 = local_70 + iVar5;
    piVar22 = piVar19;
    piVar24 = piVar19;
    piVar21 = local_70;
    piVar20 = local_70;
    while ((piVar19 < piVar23 && (piVar21 < piVar14))) {
      iVar5 = *piVar19;
      iVar8 = *piVar21;
      if (iVar5 == iVar8) {
        Vec_IntPush(pVVar15,iVar5);
        piVar19 = piVar19 + 1;
        piVar21 = piVar21 + 1;
        piVar22 = piVar24;
      }
      else if (iVar5 < iVar8) {
        piVar19 = piVar19 + 1;
        *piVar24 = iVar5;
        piVar22 = piVar22 + 1;
        piVar24 = piVar24 + 1;
      }
      else {
        piVar21 = piVar21 + 1;
        *piVar20 = iVar8;
        piVar20 = piVar20 + 1;
        local_70 = local_70 + 1;
        piVar22 = piVar24;
      }
    }
    for (lVar18 = 0; (int *)(lVar18 + (long)piVar19) < piVar23; lVar18 = lVar18 + 4) {
      *(int *)((long)piVar24 + lVar18) = *(int *)(lVar18 + (long)piVar19);
      piVar22 = piVar22 + 1;
    }
    for (lVar18 = 0; (int *)(lVar18 + (long)piVar21) < piVar14; lVar18 = lVar18 + 4) {
      *(int *)((long)piVar20 + lVar18) = *(int *)(lVar18 + (long)piVar21);
      local_70 = local_70 + 1;
    }
    Vec_IntShrink(pVVar16,(int)((ulong)((long)piVar22 - (long)pVVar16->pArray) >> 2));
    Vec_IntShrink(pVVar17,(int)((ulong)((long)local_70 - (long)pVVar17->pArray) >> 2));
  }
  else {
    iVar7 = -1;
    iVar6 = -1;
  }
  pFxchMan->vPairs->nSize = 0;
  pVVar15 = Vec_WecEntry(pFxchMan->vDivCubePairs,iDiv);
  Vec_IntAppend(pFxchMan->vPairs,pVVar15);
  if (pVVar15->pArray != (int *)0x0) {
    free(pVVar15->pArray);
    pVVar15->pArray = (int *)0x0;
  }
  pVVar15->nCap = 0;
  pVVar15->nSize = 0;
  for (iVar5 = 1; pVVar15 = pFxchMan->vPairs, iVar5 < pVVar15->nSize; iVar5 = iVar5 + 2) {
    iVar8 = Vec_IntEntry(pVVar15,iVar5 + -1);
    iVar9 = Vec_IntEntry(pFxchMan->vPairs,iVar5);
    iVar10 = Fxch_ManGetLit(pFxchMan,iVar8,iLit);
    iVar11 = Fxch_ManGetLit(pFxchMan,iVar9,iLit_00);
    if (iVar10 != iVar11) {
      __assert_fail("Fxch_ManGetLit( pFxchMan, iCube0, 0) == Fxch_ManGetLit( pFxchMan, iCube1, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                    ,0x26f,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
    }
    if (iVar9 < iVar8) {
      Vec_IntSetEntry(pFxchMan->vPairs,iVar5 + -1,iVar9);
      Vec_IntSetEntry(pFxchMan->vPairs,iVar5,iVar8);
    }
  }
  Vec_IntUniqifyPairs(pVVar15);
  if ((pFxchMan->vPairs->nSize & 1) != 0) {
    __assert_fail("Vec_IntSize( pFxchMan->vPairs ) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                  ,0x278,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
  }
  for (iVar5 = 0; iVar5 < pFxchMan->vCubesS->nSize; iVar5 = iVar5 + 1) {
    iVar8 = Vec_IntEntry(pFxchMan->vCubesS,iVar5);
    Fxch_ManDivSingleCube(pFxchMan,iVar8,0,1);
    iVar9 = Vec_WecEntryEntry(pFxchMan->vCubes,iVar8,k);
    if (iVar9 == 0) {
      Fxch_ManDivDoubleCube(pFxchMan,iVar8,0,1);
    }
  }
  iVar5 = 1;
  for (iVar8 = 0; iVar8 < pFxchMan->vPairs->nSize; iVar8 = iVar8 + 1) {
    iVar9 = Vec_IntEntry(pFxchMan->vPairs,iVar8);
    Fxch_ManDivSingleCube(pFxchMan,iVar9,0,1);
    iVar10 = Vec_WecEntryEntry(pFxchMan->vCubes,iVar9,k_00);
    if (iVar10 == 0) {
      Fxch_ManDivDoubleCube(pFxchMan,iVar9,0,1);
    }
  }
  pFxchMan->vCubesToUpdate->nSize = 0;
  iVar8 = Fxch_DivIsNotConstant1(pFxchMan->vDiv);
  if (iVar8 == 0) {
    iVar8 = 0;
  }
  else {
    iVar8 = pFxchMan->nVars;
    pFxchMan->nVars = iVar8 + 1;
    for (lVar18 = 0; lVar18 < pFxchMan->nSizeOutputID; lVar18 = lVar18 + 1) {
      pFxchMan->pTempOutputID[lVar18] = 0;
    }
    pVVar15 = pFxchMan->vLitHashKeys;
    uVar12 = Gia_ManRandom(0);
    Vec_IntPush(pVVar15,uVar12 & 0x3ffffff);
    pVVar15 = pFxchMan->vLitHashKeys;
    uVar12 = Gia_ManRandom(0);
    Vec_IntPush(pVVar15,uVar12 & 0x3ffffff);
    pVVar15 = Vec_WecPushLevel(pFxchMan->vCubes);
    Vec_IntPush(pVVar15,iVar8);
    Vec_IntPushArray(pFxchMan->vOutputID,pFxchMan->pTempOutputID,pFxchMan->nSizeOutputID);
    if (pFxchMan->vDiv->nSize == 2) {
      iVar5 = iVar7;
      if (iVar7 < iVar6) {
        iVar5 = iVar6;
      }
      iVar9 = iVar7;
      if (iVar6 < iVar7) {
        iVar9 = iVar6;
      }
      iVar9 = Abc_LitNot(iVar9);
      Vec_IntPush(pVVar15,iVar9);
      iVar5 = Abc_LitNot(iVar5);
      Vec_IntPush(pVVar15,iVar5);
      iVar9 = Fxch_ManComputeLevelCube(pFxchMan,pVVar15);
      iVar9 = iVar9 + 1;
    }
    else {
      pVVar16 = Vec_WecPushLevel(pFxchMan->vCubes);
      Vec_IntPush(pVVar16,iVar8);
      Vec_IntPushArray(pFxchMan->vOutputID,pFxchMan->pTempOutputID,pFxchMan->nSizeOutputID);
      pVVar17 = Fxch_ManGetCube(pFxchMan,pFxchMan->vCubes->nSize + -2);
      Fxch_DivSepareteCubes(pFxchMan->vDiv,pVVar17,pVVar16);
      iVar10 = Fxch_ManComputeLevelCube(pFxchMan,pVVar17);
      iVar9 = Fxch_ManComputeLevelCube(pFxchMan,pVVar16);
      pVVar15 = pFxchMan->vCubesToUpdate;
      iVar11 = Vec_WecLevelId(pFxchMan->vCubes,pVVar17);
      Vec_IntPush(pVVar15,iVar11);
      pVVar15 = pFxchMan->vCubesToUpdate;
      iVar11 = Vec_WecLevelId(pFxchMan->vCubes,pVVar16);
      Vec_IntPush(pVVar15,iVar11);
      for (; iVar5 < pVVar17->nSize; iVar5 = iVar5 + 1) {
        iVar11 = Vec_IntEntry(pVVar17,iVar5);
        pVVar3 = pFxchMan->vLits;
        iVar13 = Vec_WecLevelId(pFxchMan->vCubes,pVVar17);
        Vec_WecPush(pVVar3,iVar11,iVar13);
      }
      for (iVar5 = 1; iVar5 < pVVar16->nSize; iVar5 = iVar5 + 1) {
        iVar11 = Vec_IntEntry(pVVar16,iVar5);
        pVVar3 = pFxchMan->vLits;
        iVar13 = Vec_WecLevelId(pFxchMan->vCubes,pVVar16);
        Vec_WecPush(pVVar3,iVar11,iVar13);
      }
      if (iVar9 < iVar10) {
        iVar9 = iVar10;
      }
      iVar9 = iVar9 + 2;
    }
    if (pFxchMan->vLevels->nSize != iVar8) {
      __assert_fail("Vec_IntSize( pFxchMan->vLevels ) == iVarNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                    ,0x23c,"int Fxch_ManCreateCube(Fxch_Man_t *, int, int)");
    }
    Vec_IntPush(pFxchMan->vLevels,iVar9);
    pFxchMan->nLits = pFxchMan->nLits + pFxchMan->vDiv->nSize;
    Vec_WecPushLevel(pFxchMan->vLits);
    Vec_WecPushLevel(pFxchMan->vLits);
    pVVar15 = Vec_WecEntry(pFxchMan->vLits,pFxchMan->vLits->nSize + -2);
    for (iVar5 = 0; iVar5 < pFxchMan->vCubesS->nSize; iVar5 = iVar5 + 1) {
      iVar9 = Vec_IntEntry(pFxchMan->vCubesS,iVar5);
      pVVar16 = Fxch_ManGetCube(pFxchMan,iVar9);
      iVar10 = Abc_LitNot(iVar6);
      iVar10 = Vec_IntRemove1(pVVar16,iVar10);
      iVar11 = Abc_LitNot(iVar7);
      iVar11 = Vec_IntRemove1(pVVar16,iVar11);
      if (iVar11 + iVar10 != 2) {
        __assert_fail("RetValue == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                      ,0x179,
                      "void Fxch_ManExtractDivFromCube(Fxch_Man_t *, const int, const int, const int)"
                     );
      }
      iVar10 = Abc_Var2Lit(iVar8,0);
      Vec_IntPush(pVVar16,iVar10);
      iVar10 = Vec_WecLevelId(pFxchMan->vCubes,pVVar16);
      Vec_IntPush(pVVar15,iVar10);
      Vec_IntPush(pFxchMan->vCubesToUpdate,iVar9);
      pFxchMan->nLits = pFxchMan->nLits + -1;
    }
  }
  Fxch_ManExtractDivFromCubePairs(pFxchMan,iVar8);
  pVVar15 = pFxchMan->vCubesToUpdate;
  iVar5 = pVVar15->nSize;
  if (iVar5 == 0) {
    __assert_fail("Vec_IntSize( pFxchMan->vCubesToUpdate )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                  ,0x295,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
  }
  for (iVar6 = 0; iVar6 < iVar5; iVar6 = iVar6 + 1) {
    iVar5 = Vec_IntEntry(pVVar15,iVar6);
    Fxch_ManDivSingleCube(pFxchMan,iVar5,1,1);
    iVar7 = Vec_WecEntryEntry(pFxchMan->vCubes,iVar5,k_01);
    if (iVar7 == 0) {
      Fxch_ManDivDoubleCube(pFxchMan,iVar5,1,1);
    }
    pVVar15 = pFxchMan->vCubesToUpdate;
    iVar5 = pVVar15->nSize;
  }
  if (pFxchMan->vSCC->nSize != 0) {
    Vec_IntUniqifyPairs(pFxchMan->vSCC);
    pVVar15 = pFxchMan->vSCC;
    uVar12 = pVVar15->nSize;
    if ((uVar12 & 1) != 0) {
      __assert_fail("Vec_IntSize( pFxchMan->vSCC ) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                    ,0x2a4,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
    }
    for (i = 0; (int)(i | 1) < (int)uVar12; i = i + 2) {
      iVar5 = Vec_IntEntry(pVVar15,i);
      iVar6 = Vec_IntEntry(pFxchMan->vSCC,i | 1);
      piVar14 = Vec_IntEntryP(pFxchMan->vOutputID,pFxchMan->nSizeOutputID * iVar5);
      piVar19 = Vec_IntEntryP(pFxchMan->vOutputID,pFxchMan->nSizeOutputID * iVar6);
      pVVar15 = Vec_WecEntry(pFxchMan->vCubes,iVar5);
      pVVar16 = Vec_WecEntry(pFxchMan->vCubes,iVar6);
      if ((pVVar15->nCap & 0x40000000) == 0) {
        Fxch_ManDivSingleCube(pFxchMan,iVar5,0,1);
        Fxch_ManDivDoubleCube(pFxchMan,iVar5,0,1);
        pbVar1 = (byte *)((long)&pVVar15->nCap + 3);
        *pbVar1 = *pbVar1 | 0x40;
      }
      if ((pVVar16->nCap & 0x40000000) == 0) {
        Fxch_ManDivSingleCube(pFxchMan,iVar6,0,1);
        Fxch_ManDivDoubleCube(pFxchMan,iVar6,0,1);
        pbVar1 = (byte *)((long)&pVVar16->nCap + 3);
        *pbVar1 = *pbVar1 | 0x40;
      }
      if (pVVar15->nSize == pVVar16->nSize) {
        for (lVar18 = 0; lVar18 < pFxchMan->nSizeOutputID; lVar18 = lVar18 + 1) {
          piVar19[lVar18] = piVar19[lVar18] | piVar14[lVar18];
          piVar14[lVar18] = 0;
        }
LAB_003fe78e:
        pVVar16 = Vec_WecEntry(pFxchMan->vCubes,iVar5);
        pVVar16->nSize = 0;
        pbVar1 = (byte *)((long)&pVVar15->nCap + 3);
        *pbVar1 = *pbVar1 ^ 0x40;
      }
      else {
        iVar6 = pFxchMan->nSizeOutputID;
        bVar25 = true;
        lVar18 = 0;
        while ((lVar18 < iVar6 && (bVar25))) {
          bVar25 = piVar14[lVar18] == piVar19[lVar18];
          lVar18 = lVar18 + 1;
        }
        if (bVar25) goto LAB_003fe78e;
        uVar12 = 0;
        for (lVar18 = 0; lVar18 < iVar6; lVar18 = lVar18 + 1) {
          uVar12 = uVar12 | ~piVar19[lVar18] & piVar14[lVar18];
          piVar14[lVar18] = ~piVar19[lVar18] & piVar14[lVar18];
          iVar6 = pFxchMan->nSizeOutputID;
        }
        if (uVar12 == 0) goto LAB_003fe78e;
      }
      pVVar15 = pFxchMan->vSCC;
      uVar12 = pVVar15->nSize;
    }
    for (iVar5 = 1; iVar5 < (int)uVar12; iVar5 = iVar5 + 2) {
      iVar6 = Vec_IntEntry(pVVar15,iVar5 + -1);
      iVar7 = Vec_IntEntry(pFxchMan->vSCC,iVar5);
      pVVar15 = Vec_WecEntry(pFxchMan->vCubes,iVar6);
      pVVar16 = Vec_WecEntry(pFxchMan->vCubes,iVar7);
      if ((pVVar15->nCap & 0x40000000) != 0) {
        Fxch_ManDivSingleCube(pFxchMan,iVar6,1,1);
        Fxch_ManDivDoubleCube(pFxchMan,iVar6,1,1);
        pbVar1 = (byte *)((long)&pVVar15->nCap + 3);
        *pbVar1 = *pbVar1 ^ 0x40;
      }
      if ((pVVar16->nCap & 0x40000000) != 0) {
        Fxch_ManDivSingleCube(pFxchMan,iVar7,1,1);
        Fxch_ManDivDoubleCube(pFxchMan,iVar7,1,1);
        pbVar1 = (byte *)((long)&pVVar16->nCap + 3);
        *pbVar1 = *pbVar1 ^ 0x40;
      }
      pVVar15 = pFxchMan->vSCC;
      uVar12 = pVVar15->nSize;
    }
    pVVar15->nSize = 0;
  }
  pFxchMan->nExtDivs = pFxchMan->nExtDivs + 1;
  return;
}

Assistant:

void Fxch_ManUpdate( Fxch_Man_t* pFxchMan,
                     int iDiv )
{
    int i, iCube0, iCube1,
        Lit0 = -1,
        Lit1 = -1,
        iVarNew;

    Vec_Int_t* vCube0,
             * vCube1,
             * vDivCubePairs;

    /* Get the selected candidate (divisor) */
    Vec_IntClear( pFxchMan->vDiv );
    Vec_IntAppend( pFxchMan->vDiv, Hsh_VecReadEntry( pFxchMan->pDivHash, iDiv ) );

    /* Find cubes associated with the divisor */
    Vec_IntClear( pFxchMan->vCubesS );
    if ( Vec_IntSize( pFxchMan->vDiv ) == 2 )
    {
        Lit0 = Abc_Lit2Var( Vec_IntEntry( pFxchMan->vDiv, 0 ) );
        Lit1 = Abc_Lit2Var( Vec_IntEntry( pFxchMan->vDiv, 1 ) );
        assert( Lit0 >= 0 && Lit1 >= 0 );

        Fxch_ManCompressCubes( pFxchMan->vCubes, Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit0 ) ) );
        Fxch_ManCompressCubes( pFxchMan->vCubes, Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit1 ) ) );
        Vec_IntTwoRemoveCommon( Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit0 ) ),
                                Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit1 ) ),
                                pFxchMan->vCubesS );
    }

    /* Find pairs associated with the divisor */
    Vec_IntClear( pFxchMan->vPairs );
    vDivCubePairs = Vec_WecEntry( pFxchMan->vDivCubePairs, iDiv );
    Vec_IntAppend( pFxchMan->vPairs, vDivCubePairs );
    Vec_IntErase( vDivCubePairs );

    Vec_IntForEachEntryDouble( pFxchMan->vPairs, iCube0, iCube1, i )
    {
        assert( Fxch_ManGetLit( pFxchMan, iCube0, 0) == Fxch_ManGetLit( pFxchMan, iCube1, 0) );
        if (iCube0 > iCube1)
        {
            Vec_IntSetEntry( pFxchMan->vPairs, i, iCube1);
            Vec_IntSetEntry( pFxchMan->vPairs, i+1, iCube0);
        }
    }

    Vec_IntUniqifyPairs( pFxchMan->vPairs );
    assert( Vec_IntSize( pFxchMan->vPairs ) % 2 == 0 );

    /* subtract cost of single-cube divisors */
    Vec_IntForEachEntry( pFxchMan->vCubesS, iCube0, i )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube0, 0, 1);

        if ( Vec_WecEntryEntry( pFxchMan->vCubes, iCube0, 0 ) == 0 )
            Fxch_ManDivDoubleCube( pFxchMan, iCube0, 0, 1 );
    }

    Vec_IntForEachEntry( pFxchMan->vPairs, iCube0, i )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube0, 0, 1);

        if ( Vec_WecEntryEntry( pFxchMan->vCubes, iCube0, 0 ) == 0 )
            Fxch_ManDivDoubleCube( pFxchMan, iCube0, 0, 1 );
    }

    Vec_IntClear( pFxchMan->vCubesToUpdate );
    if ( Fxch_DivIsNotConstant1( pFxchMan->vDiv ) )
    {
        iVarNew = Fxch_ManCreateCube( pFxchMan, Lit0, Lit1 );
        Fxch_ManExtractDivFromCube( pFxchMan, Lit0, Lit1, iVarNew );
        Fxch_ManExtractDivFromCubePairs( pFxchMan, iVarNew );
    }
    else
        Fxch_ManExtractDivFromCubePairs( pFxchMan, 0 );

    assert( Vec_IntSize( pFxchMan->vCubesToUpdate ) );

    /* Add cost */
    Vec_IntForEachEntry( pFxchMan->vCubesToUpdate, iCube0, i )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube0, 1, 1 );

        if ( Vec_WecEntryEntry( pFxchMan->vCubes, iCube0, 0 ) == 0 )
            Fxch_ManDivDoubleCube( pFxchMan, iCube0, 1, 1 );
    }

    /* Deal with SCC */
    if ( Vec_IntSize( pFxchMan->vSCC ) )
    {
        Vec_IntUniqifyPairs( pFxchMan->vSCC );
        assert( Vec_IntSize( pFxchMan->vSCC ) % 2 == 0 );

        Vec_IntForEachEntryDouble( pFxchMan->vSCC, iCube0, iCube1, i )
        {
            int j, RetValue = 1;
            int* pOutputID0 = Vec_IntEntryP( pFxchMan->vOutputID, iCube0 * pFxchMan->nSizeOutputID );
            int* pOutputID1 = Vec_IntEntryP( pFxchMan->vOutputID, iCube1 * pFxchMan->nSizeOutputID );
            vCube0 = Vec_WecEntry( pFxchMan->vCubes, iCube0 );
            vCube1 = Vec_WecEntry( pFxchMan->vCubes, iCube1 );

            if ( !Vec_WecIntHasMark( vCube0 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube0, 0, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube0, 0, 1 );
                Vec_WecIntSetMark( vCube0 );
            }

            if ( !Vec_WecIntHasMark( vCube1 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube1, 0, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube1, 0, 1 );
                Vec_WecIntSetMark( vCube1 );
            }

            if ( Vec_IntSize( vCube0 ) == Vec_IntSize( vCube1 ) )
            {
                for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
                {
                    pOutputID1[j] |= pOutputID0[j];
                    pOutputID0[j] = 0;
                }
                Vec_IntClear( Vec_WecEntry( pFxchMan->vCubes, iCube0 ) );
                Vec_WecIntXorMark( vCube0 );
                continue;
            }

            for ( j = 0; j < pFxchMan->nSizeOutputID && RetValue; j++ )
                RetValue = ( pOutputID0[j] == pOutputID1[j] );

            if ( RetValue )
            {
                Vec_IntClear( Vec_WecEntry( pFxchMan->vCubes, iCube0 ) );
                Vec_WecIntXorMark( vCube0 );
            }
            else
            {
                RetValue = 0;
                for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
                {
                    RetValue |= ( pOutputID0[j] & ~( pOutputID1[j] ) );
                    pOutputID0[j] &= ~( pOutputID1[j] );
                }

                if ( RetValue == 0 )
                {
                    Vec_IntClear( Vec_WecEntry( pFxchMan->vCubes, iCube0 ) );
                    Vec_WecIntXorMark( vCube0 );
                }
            }
        }

        Vec_IntForEachEntryDouble( pFxchMan->vSCC, iCube0, iCube1, i )
        {
            vCube0 = Vec_WecEntry( pFxchMan->vCubes, iCube0 );
            vCube1 = Vec_WecEntry( pFxchMan->vCubes, iCube1 );

            if ( Vec_WecIntHasMark( vCube0 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube0, 1, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube0, 1, 1 );
                Vec_WecIntXorMark( vCube0 );
            }

            if ( Vec_WecIntHasMark( vCube1 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube1, 1, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube1, 1, 1 );
                Vec_WecIntXorMark( vCube1 );
            }
        }

        Vec_IntClear( pFxchMan->vSCC );
    }

    pFxchMan->nExtDivs++;
}